

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

string * __thiscall
iutest::detail::ElementsAreMatcherBase::
WhichIs<0,std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::LtMatcher<int>>>
          (string *__return_storage_ptr__,ElementsAreMatcherBase *this,
          tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::LtMatcher<int>_>
          *matchers)

{
  type **in_RCX;
  string local_50;
  allocator<char> local_1a;
  undefined1 local_19;
  ElementsAreMatcherBase *local_18;
  tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::LtMatcher<int>_>
  *matchers_local;
  string *str;
  
  local_19 = 0;
  local_18 = this;
  matchers_local =
       (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::LtMatcher<int>_>
        *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ElementsAre: {",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  WhichIs_<std::tuple<iutest::detail::GeMatcher<int>,iutest::detail::GtMatcher<int>,iutest::detail::LtMatcher<int>>,0,2>
            (&local_50,local_18,
             (tuple<iutest::detail::GeMatcher<int>,_iutest::detail::GtMatcher<int>,_iutest::detail::LtMatcher<int>_>
              *)&iutest_type_traits::enabler_t<void>::value,in_RCX);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
  return __return_storage_ptr__;
}

Assistant:

static ::std::string WhichIs(const T& matchers)
    {
        ::std::string str = "ElementsAre: {";
        str += WhichIs_<T, N, tuples::tuple_size<T>::value-1>(matchers);
        str += "}";
        return str;
    }